

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvRoberts_dns_constraints.c
# Opt level: O3

int Jac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2
       ,N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  double *pdVar6;
  double *pdVar7;
  
  lVar3 = *(long *)((long)y->content + 0x10);
  dVar1 = *(double *)(lVar3 + 8);
  dVar2 = *(double *)(lVar3 + 0x10);
  puVar4 = *(undefined8 **)((long)J->content + 0x20);
  puVar5 = (undefined8 *)*puVar4;
  *puVar5 = 0xbfa47ae147ae147b;
  pdVar6 = (double *)puVar4[1];
  *pdVar6 = dVar2 * 10000.0;
  pdVar7 = (double *)puVar4[2];
  *pdVar7 = dVar1 * 10000.0;
  puVar5[1] = 0x3fa47ae147ae147b;
  pdVar6[1] = dVar2 * -10000.0 - dVar1 * 60000000.0;
  pdVar7[1] = dVar1 * -10000.0;
  puVar5[2] = 0;
  pdVar6[2] = dVar1 * 60000000.0;
  pdVar7[2] = 0.0;
  return 0;
}

Assistant:

static int Jac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
               void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype y2, y3;

  y2 = Ith(y, 2);
  y3 = Ith(y, 3);

  IJth(J, 1, 1) = SUN_RCONST(-0.04);
  IJth(J, 1, 2) = SUN_RCONST(1.0e4) * y3;
  IJth(J, 1, 3) = SUN_RCONST(1.0e4) * y2;

  IJth(J, 2, 1) = SUN_RCONST(0.04);
  IJth(J, 2, 2) = SUN_RCONST(-1.0e4) * y3 - SUN_RCONST(6.0e7) * y2;
  IJth(J, 2, 3) = SUN_RCONST(-1.0e4) * y2;

  IJth(J, 3, 1) = ZERO;
  IJth(J, 3, 2) = SUN_RCONST(6.0e7) * y2;
  IJth(J, 3, 3) = ZERO;

  return (0);
}